

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

void ImGui::TableEndRow(ImGuiTable *table)

{
  float fVar1;
  float fVar2;
  char cVar3;
  ImGuiWindow *pIVar4;
  ImDrawList *pIVar5;
  bool bVar6;
  float fVar7;
  float fVar8;
  ImGuiTableColumn *pIVar9;
  ImGuiTableCellData *pIVar10;
  ImGuiTableCellData *pIVar11;
  ImU32 col;
  int column_n;
  int iVar12;
  ImU32 col_00;
  ImU32 col_01;
  bool bVar13;
  uint uVar14;
  float fVar15;
  ImRect row_rect;
  ImVec2 local_38;
  
  pIVar4 = GImGui->CurrentWindow;
  if (pIVar4 != table->InnerWindow) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_widgets.cpp"
                ,0x24f5,"TableEndRow","ImGui ASSERT FAILED: %s","window == table->InnerWindow");
  }
  if (table->IsInsideRow == false) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_widgets.cpp"
                ,0x24f6,"TableEndRow","ImGui ASSERT FAILED: %s","table->IsInsideRow");
  }
  TableEndCell(table);
  fVar1 = table->RowPosY2;
  (pIVar4->DC).CursorPos.y = fVar1;
  fVar2 = table->RowPosY1;
  iVar12 = table->CurrentRow;
  bVar6 = 0 < table->FreezeRowsCount;
  bVar13 = iVar12 + 1 == (int)table->FreezeRowsCount;
  if (iVar12 == 0) {
    table->LastFirstRowHeight = fVar1 - fVar2;
LAB_001c7363:
    if ((fVar1 < (table->InnerClipRect).Min.y) || ((table->InnerClipRect).Max.y < fVar2))
    goto LAB_001c737d;
    col_01 = table->RowBgColor[0];
    if ((col_01 == 0x1000000) && (col_01 = 0, (table->Flags & 0x40) != 0)) {
      col_01 = GetColorU32((table->RowBgColorCounter & 1U) + 0x2d,1.0);
      iVar12 = table->CurrentRow;
    }
    col = 0;
    col_00 = table->RowBgColor[1];
    if (table->RowBgColor[1] == 0x1000000) {
      col_00 = 0;
    }
    if ((((iVar12 != 0) || (table->InnerWindow == table->OuterWindow)) && (col = 0, 0 < iVar12)) &&
       ((table->Flags & 0x80U) != 0)) {
      col = table->RowBgColor[(ulong)((table->field_0x96 & 1) == 0) + 2];
    }
    cVar3 = table->RowCellDataCount;
    if (('\0' < cVar3 || bVar13 && bVar6) || (col != 0 || (col_00 != 0 || col_01 != 0))) {
      fVar15 = (table->HostClipRect).Min.y;
      fVar7 = (table->HostClipRect).Max.x;
      fVar8 = (table->HostClipRect).Max.y;
      pIVar5 = pIVar4->DrawList;
      (pIVar5->_CmdHeader).ClipRect.x = (table->HostClipRect).Min.x;
      (pIVar5->_CmdHeader).ClipRect.y = fVar15;
      (pIVar5->_CmdHeader).ClipRect.z = fVar7;
      (pIVar5->_CmdHeader).ClipRect.w = fVar8;
      ImDrawListSplitter::SetCurrentChannel(&table->DrawSplitter,pIVar4->DrawList,0);
    }
    if (col_00 != 0 || col_01 != 0) {
      row_rect.Min.x = (table->WorkRect).Min.x;
      row_rect.Max.x = (table->WorkRect).Max.x;
      row_rect.Min.y = fVar2;
      row_rect.Max.y = fVar1;
      ImRect::ClipWith(&row_rect,&table->BackgroundClipRect);
      if ((col_01 != 0) && (row_rect.Min.y < row_rect.Max.y)) {
        ImDrawList::AddRectFilled(pIVar4->DrawList,&row_rect.Min,&row_rect.Max,col_01,0.0,0xf);
      }
      if ((col_00 != 0) && (row_rect.Min.y < row_rect.Max.y)) {
        ImDrawList::AddRectFilled(pIVar4->DrawList,&row_rect.Min,&row_rect.Max,col_00,0.0,0xf);
      }
    }
    if ('\0' < cVar3) {
      pIVar10 = ImSpan<ImGuiTableCellData>::operator[]
                          (&table->RowCellData,table->RowCellDataCount + -1);
      pIVar11 = ImSpan<ImGuiTableCellData>::operator[](&table->RowCellData,0);
      for (; pIVar11 <= pIVar10; pIVar11 = pIVar11 + 1) {
        pIVar9 = ImSpan<ImGuiTableColumn>::operator[](&table->Columns,(int)pIVar11->Column);
        row_rect.Max.x = pIVar9->MaxX;
        row_rect.Min.x = pIVar9->MinX - table->CellSpacingX;
        row_rect.Min.y = fVar2;
        row_rect.Max.y = fVar1;
        ImRect::ClipWith(&row_rect,&table->BackgroundClipRect);
        ImDrawList::AddRectFilled
                  (pIVar4->DrawList,&row_rect.Min,&row_rect.Max,pIVar11->BgColor,0.0,0xf);
      }
    }
    if (((col != 0) && ((table->BackgroundClipRect).Min.y <= fVar2)) &&
       (fVar2 < (table->BackgroundClipRect).Max.y)) {
      row_rect.Min.x = table->BorderX1;
      local_38.x = table->BorderX2;
      row_rect.Min.y = fVar2;
      local_38.y = fVar2;
      ImDrawList::AddLine(pIVar4->DrawList,&row_rect.Min,&local_38,col,1.0);
    }
    if (!bVar13 || !bVar6) goto LAB_001c77f0;
    if (((table->BackgroundClipRect).Min.y <= fVar1) && (fVar1 < (table->BackgroundClipRect).Max.y))
    {
      row_rect.Min.x = table->BorderX1;
      local_38.x = table->BorderX2;
      row_rect.Min.y = fVar1;
      local_38.y = fVar1;
      ImDrawList::AddLine(pIVar4->DrawList,&row_rect.Min,&local_38,table->BorderColorStrong,1.0);
    }
  }
  else {
    if (-1 < iVar12) goto LAB_001c7363;
LAB_001c737d:
    if (!bVar13 || !bVar6) goto LAB_001c77f0;
  }
  if (table->IsFreezeRowsPassed != false) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_widgets.cpp"
                ,0x255a,"TableEndRow","ImGui ASSERT FAILED: %s","table->IsFreezeRowsPassed == false"
               );
  }
  table->IsFreezeRowsPassed = true;
  ImDrawListSplitter::SetCurrentChannel(&table->DrawSplitter,pIVar4->DrawList,0);
  fVar1 = table->RowPosY2;
  fVar2 = (pIVar4->InnerClipRect).Min.y;
  fVar15 = (pIVar4->InnerClipRect).Max.y;
  uVar14 = -(uint)(fVar2 <= fVar1 + 1.0);
  fVar7 = (float)(~uVar14 & (uint)fVar2 | (uint)(fVar1 + 1.0) & uVar14);
  fVar2 = (table->InnerClipRect).Max.x;
  (table->BackgroundClipRect).Min.x = (table->InnerClipRect).Min.x;
  (table->BackgroundClipRect).Min.y = fVar7;
  (table->BackgroundClipRect).Max.x = fVar2;
  (table->BackgroundClipRect).Max.y = fVar15;
  fVar2 = table->RowPosY1;
  fVar15 = (fVar1 + (table->WorkRect).Min.y) - (table->OuterRect).Min.y;
  (pIVar4->DC).CursorPos.y = fVar15;
  table->RowPosY2 = fVar15;
  table->RowPosY1 = fVar15 - (fVar1 - fVar2);
  for (iVar12 = 0; iVar12 < table->ColumnsCount; iVar12 = iVar12 + 1) {
    pIVar9 = ImSpan<ImGuiTableColumn>::operator[](&table->Columns,iVar12);
    pIVar9->DrawChannelCurrent = pIVar9->DrawChannelRowsAfterFreeze;
    (pIVar9->ClipRect).Min.y = fVar7;
  }
LAB_001c77f0:
  if ((table->field_0x94 & 1) == 0) {
    table->RowBgColorCounter = table->RowBgColorCounter + 1;
  }
  table->IsInsideRow = false;
  return;
}

Assistant:

void    ImGui::TableEndRow(ImGuiTable* table)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    IM_ASSERT(window == table->InnerWindow);
    IM_ASSERT(table->IsInsideRow);

    TableEndCell(table);

    // Position cursor at the bottom of our row so it can be used for e.g. clipping calculation. However it is
    // likely that the next call to TableBeginCell() will reposition the cursor to take account of vertical padding.
    window->DC.CursorPos.y = table->RowPosY2;

    // Row background fill
    const float bg_y1 = table->RowPosY1;
    const float bg_y2 = table->RowPosY2;

    const bool unfreeze_rows = (table->CurrentRow + 1 == table->FreezeRowsCount && table->FreezeRowsCount > 0);

    if (table->CurrentRow == 0)
        table->LastFirstRowHeight = bg_y2 - bg_y1;

    const bool is_visible = table->CurrentRow >= 0 && bg_y2 >= table->InnerClipRect.Min.y && bg_y1 <= table->InnerClipRect.Max.y;
    if (is_visible)
    {
        // Decide of background color for the row
        ImU32 bg_col0 = 0;
        ImU32 bg_col1 = 0;
        if (table->RowBgColor[0] != IM_COL32_DISABLE)
            bg_col0 = table->RowBgColor[0];
        else if (table->Flags & ImGuiTableFlags_RowBg)
            bg_col0 = GetColorU32((table->RowBgColorCounter & 1) ? ImGuiCol_TableRowBgAlt : ImGuiCol_TableRowBg);
        if (table->RowBgColor[1] != IM_COL32_DISABLE)
            bg_col1 = table->RowBgColor[1];

        // Decide of top border color
        ImU32 border_col = 0;
        const float border_size = TABLE_BORDER_SIZE;
        if (table->CurrentRow != 0 || table->InnerWindow == table->OuterWindow)
        {
            if (table->Flags & ImGuiTableFlags_BordersInnerH)
            {
                //if (table->CurrentRow == 0 && table->InnerWindow == table->OuterWindow)
                //    border_col = table->BorderOuterColor;
                //else
                if (table->CurrentRow > 0)// && !(table->LastRowFlags & ImGuiTableRowFlags_Headers))
                    border_col = (table->LastRowFlags & ImGuiTableRowFlags_Headers) ? table->BorderColorStrong : table->BorderColorLight;
            }
            else
            {
                //if (table->RowFlags & ImGuiTableRowFlags_Headers)
                //    border_col = table->BorderOuterColor;
            }
        }

        const bool draw_cell_bg_color = table->RowCellDataCount > 0;
        const bool draw_strong_bottom_border = unfreeze_rows;// || (table->RowFlags & ImGuiTableRowFlags_Headers);
        if ((bg_col0 | bg_col1 | border_col) != 0 || draw_strong_bottom_border || draw_cell_bg_color)
        {
            // In theory we could call SetWindowClipRectBeforeChannelChange() but since we know TableEndRow() is
            // always followed by a change of clipping rectangle we perform the smallest overwrite possible here.
            window->DrawList->_CmdHeader.ClipRect = table->HostClipRect.ToVec4();
            table->DrawSplitter.SetCurrentChannel(window->DrawList, 0);
        }

        // Draw row background
        // We soft/cpu clip this so all backgrounds and borders can share the same clipping rectangle
        if (bg_col0 || bg_col1)
        {
            ImRect row_rect(table->WorkRect.Min.x, bg_y1, table->WorkRect.Max.x, bg_y2);
            row_rect.ClipWith(table->BackgroundClipRect);
            if (bg_col0 != 0 && row_rect.Min.y < row_rect.Max.y)
                window->DrawList->AddRectFilled(row_rect.Min, row_rect.Max, bg_col0);
            if (bg_col1 != 0 && row_rect.Min.y < row_rect.Max.y)
                window->DrawList->AddRectFilled(row_rect.Min, row_rect.Max, bg_col1);
        }

        // Draw cell background color
        if (draw_cell_bg_color)
        {
            ImGuiTableCellData* cell_data_end = &table->RowCellData[table->RowCellDataCount - 1];
            for (ImGuiTableCellData* cell_data = &table->RowCellData[0]; cell_data <= cell_data_end; cell_data++)
            {
                ImGuiTableColumn* column = &table->Columns[cell_data->Column];
                ImRect cell_rect(column->MinX - table->CellSpacingX, bg_y1, column->MaxX, bg_y2); // FIXME-TABLE: Padding currently wrong until we finish the padding refactor
                cell_rect.ClipWith(table->BackgroundClipRect);
                window->DrawList->AddRectFilled(cell_rect.Min, cell_rect.Max, cell_data->BgColor);
            }
        }

        // Draw top border
        if (border_col && bg_y1 >= table->BackgroundClipRect.Min.y && bg_y1 < table->BackgroundClipRect.Max.y)
            window->DrawList->AddLine(ImVec2(table->BorderX1, bg_y1), ImVec2(table->BorderX2, bg_y1), border_col, border_size);

        // Draw bottom border at the row unfreezing mark (always strong)
        if (draw_strong_bottom_border)
            if (bg_y2 >= table->BackgroundClipRect.Min.y && bg_y2 < table->BackgroundClipRect.Max.y)
                window->DrawList->AddLine(ImVec2(table->BorderX1, bg_y2), ImVec2(table->BorderX2, bg_y2), table->BorderColorStrong, border_size);
    }

    // End frozen rows (when we are past the last frozen row line, teleport cursor and alter clipping rectangle)
    // We need to do that in TableEndRow() instead of TableBeginRow() so the list clipper can mark end of row and
    // get the new cursor position.
    if (unfreeze_rows)
    {
        IM_ASSERT(table->IsFreezeRowsPassed == false);
        table->IsFreezeRowsPassed = true;
        table->DrawSplitter.SetCurrentChannel(window->DrawList, 0);

        ImRect r;
        r.Min.x = table->InnerClipRect.Min.x;
        r.Min.y = ImMax(table->RowPosY2 + 1, window->InnerClipRect.Min.y);
        r.Max.x = table->InnerClipRect.Max.x;
        r.Max.y = window->InnerClipRect.Max.y;
        table->BackgroundClipRect = r;

        float row_height = table->RowPosY2 - table->RowPosY1;
        table->RowPosY2 = window->DC.CursorPos.y = table->WorkRect.Min.y + table->RowPosY2 - table->OuterRect.Min.y;
        table->RowPosY1 = table->RowPosY2 - row_height;
        for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
        {
            ImGuiTableColumn* column = &table->Columns[column_n];
            column->DrawChannelCurrent = column->DrawChannelRowsAfterFreeze;
            column->ClipRect.Min.y = r.Min.y;
        }
    }

    if (!(table->RowFlags & ImGuiTableRowFlags_Headers))
        table->RowBgColorCounter++;
    table->IsInsideRow = false;
}